

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall Transporter::Receive(Transporter *this,char *data,size_t len)

{
  size_t sVar1;
  char *pcVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_a0;
  undefined1 local_80 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  document;
  allocator local_59;
  undefined1 local_58 [8];
  string text;
  size_t i;
  size_t start;
  size_t pos;
  size_t len_local;
  char *data_local;
  Transporter *this_local;
  
  if (this->bufSize < len + this->receiveSize) {
    pcVar2 = (char *)realloc(this->buf,this->bufSize + len);
    this->buf = pcVar2;
  }
  memcpy(this->buf + this->receiveSize,data,len);
  this->receiveSize = len + this->receiveSize;
  start = 0;
  do {
    sVar1 = start;
    for (text.field_2._8_8_ = start; (ulong)text.field_2._8_8_ < this->receiveSize;
        text.field_2._8_8_ = text.field_2._8_8_ + 1) {
      if (data[text.field_2._8_8_] == '\n') {
        start = text.field_2._8_8_ + 1;
        break;
      }
    }
    if (sVar1 == start) {
      if (start != 0) {
        memcpy(this->buf,this->buf + start,this->receiveSize - start);
        this->receiveSize = this->receiveSize - start;
      }
      return;
    }
    if ((this->readHead & 1U) == 0) {
      pcVar2 = this->buf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_58,pcVar2 + sVar1,start - sVar1,&local_59);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::function(&local_a0,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_a0,true,false);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::~function(&local_a0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_b0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_80);
      OnReceiveMessage(this,&local_b0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_b0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_80);
      std::__cxx11::string::~string((string *)local_58);
    }
    this->readHead = (bool)((this->readHead ^ 0xffU) & 1);
  } while( true );
}

Assistant:

void Transporter::Receive(const char* data, size_t len)
{
	if (bufSize < len + receiveSize)
	{
		// maybe a bug
		buf = static_cast<char*>(realloc(buf, bufSize + len));
	}
	memcpy(buf + receiveSize, data, len);
	receiveSize += len;

	size_t pos = 0;
	while (true)
	{
		size_t start = pos;
		for (size_t i = pos; i < receiveSize; i++)
		{
			if (data[i] == '\n')
			{
				pos = i + 1;
				break;
			}
		}
		if (start != pos)
		{
			if (readHead)
			{
				// skip
			}
			else
			{
				std::string text(buf + start, pos - start);
				auto document = nlohmann::json::parse(text);
				// bug 如果lua代码执行结束,这里行为未定义
				OnReceiveMessage(document);
			}
			readHead = !readHead;
		}
		else break;
	}

	if (pos > 0)
	{
		memcpy(buf, buf + pos, receiveSize - pos);
		receiveSize -= pos;
	}
}